

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O3

int dumbfile_seek(DUMBFILE *f,long n,int origin)

{
  int iVar1;
  long lVar2;
  
  if (origin == 2) {
    lVar2 = (*f->dfs->get_size)(f->file);
    n = n + lVar2;
  }
  else if (origin == 1) {
    n = n + f->pos;
  }
  f->pos = n;
  iVar1 = (*f->dfs->seek)(f->file,n);
  return iVar1;
}

Assistant:

int DUMBEXPORT dumbfile_seek(DUMBFILE *f, long n, int origin)
{
    switch ( origin )
    {
    case DFS_SEEK_CUR: n += f->pos; break;
    case DFS_SEEK_END: n += (*f->dfs->get_size)(f->file); break;
    }
    f->pos = n;
    return (*f->dfs->seek)(f->file, n);
}